

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_inverse_linear.c
# Opt level: O0

float fe_warp_inverse_linear_unwarped_to_warped(float linear)

{
  float temp;
  float linear_local;
  
  temp = linear;
  if (is_neutral == 0) {
    temp = linear / params[0];
  }
  return temp;
}

Assistant:

float
fe_warp_inverse_linear_unwarped_to_warped(float linear)
{
    if (is_neutral) {
        return linear;
    }
    else {
        /* nonlinear = a / linear */
        float temp = linear / params[0];
        return temp;
    }
}